

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Var1;
  pointer ppVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 in_XMM2 [16];
  double precision;
  double recall;
  uint64_t golds;
  double local_68;
  int32_t local_5c;
  double local_58;
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_50;
  uint64_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c = labelId;
  getPositiveCounts((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&local_50,this,labelId);
  if (local_50._M_impl.super__Vector_impl_data._M_start !=
      local_50._M_impl.super__Vector_impl_data._M_finish) {
    if (labelId != -1) {
      this = (Meter *)std::__detail::
                      _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->labelMetrics_,&local_5c);
    }
    local_38 = (this->metrics_).gold;
    _Var1 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<double,double>const&,double_const&)>>
                      ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        )local_50._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        )local_50._M_impl.super__Vector_impl_data._M_finish,&local_38,
                       (_Iter_comp_val<bool_(*)(const_std::pair<double,_double>_&,_const_double_&)>)
                       utils::compareFirstLess);
    for (ppVar2 = local_50._M_impl.super__Vector_impl_data._M_start;
        ppVar2 != _Var1._M_current +
                  (_Var1._M_current != local_50._M_impl.super__Vector_impl_data._M_finish);
        ppVar2 = ppVar2 + 1) {
      local_68 = 0.0;
      auVar3 = vcvtuqq2pd_avx512vl((undefined1  [16])*ppVar2);
      dVar4 = auVar3._0_8_;
      dVar5 = dVar4 + auVar3._8_8_;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_68 = dVar4 / dVar5;
      }
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,local_38);
      local_58 = (double)((ulong)(local_38 == 0) * 0x7ff8000000000000 +
                         (ulong)(local_38 != 0) * (long)(dVar4 / auVar3._0_8_));
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double&,double&>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 __return_storage_ptr__,&local_68,&local_58);
    }
    local_58 = 0.0;
    local_68 = 1.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_68,&local_58);
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}